

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyTinySVD_3x3<double>(Matrix33<double> *A)

{
  double *pdVar1;
  Matrix33 *in_RDI;
  Matrix33 *pMVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  int i_5;
  int i_4;
  int j_2;
  int i_3;
  Matrix33<double> product;
  int j_1;
  int i_2;
  Matrix33<double> S_times_Vt;
  Vec3<double> S;
  Matrix33<double> V;
  Matrix33<double> U;
  bool posDet;
  int i_1;
  double valueEps;
  double eps;
  int j;
  int i;
  double maxEntry;
  Matrix33<double> *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int local_180;
  int local_17c;
  Matrix33<double> *in_stack_fffffffffffffeb0;
  int local_130;
  int local_12c;
  Matrix33<double> *in_stack_ffffffffffffff00;
  Vec3<double> local_e0;
  Matrix33<double> local_c8;
  Matrix33<double> local_80;
  byte local_35;
  int local_34;
  double local_30;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  double local_10;
  Matrix33 *local_8;
  
  local_10 = 0.0;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      pMVar2 = local_8;
      Imath_3_2::Matrix33<double>::operator[]((Matrix33<double> *)local_8,local_14);
      std::abs((int)pMVar2);
      pdVar1 = std::max<double>(&local_10,&local_20);
      local_10 = *pdVar1;
    }
  }
  local_28 = std::numeric_limits<double>::epsilon();
  local_30 = local_10 * 10.0 * 2.220446049250313e-16;
  local_34 = 0;
  while( true ) {
    if (1 < local_34) {
      return;
    }
    local_35 = local_34 == 0;
    Imath_3_2::Matrix33<double>::Matrix33(&local_80);
    Imath_3_2::Matrix33<double>::Matrix33(&local_c8);
    Imath_3_2::Vec3<double>::Vec3(&local_e0);
    Imath_3_2::jacobiSVD<double>
              (local_8,(Matrix33 *)&local_80,(Vec3 *)&local_e0,(Matrix33 *)&local_c8,
               2.220446049250313e-16,(bool)(local_35 & 1));
    Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&stack0xfffffffffffffed8);
    for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
      for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
        pdVar1 = Imath_3_2::Vec3<double>::operator[](&local_e0,local_130);
        dVar3 = *pdVar1;
        pdVar1 = Imath_3_2::Matrix33<double>::operator[](&local_c8,local_12c);
        in_stack_fffffffffffffe70 = (Matrix33<double> *)(dVar3 * pdVar1[local_130]);
        pdVar1 = Imath_3_2::Matrix33<double>::operator[]
                           ((Matrix33<double> *)&stack0xfffffffffffffed8,local_12c);
        pdVar1[local_130] = (double)in_stack_fffffffffffffe70;
      }
    }
    Imath_3_2::Matrix33<double>::transpose(in_stack_fffffffffffffeb0);
    Imath_3_2::Matrix33<double>::operator*
              ((Matrix33<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70);
    for (local_17c = 0; local_17c < 3; local_17c = local_17c + 1) {
      for (local_180 = 0; local_180 < 3; local_180 = local_180 + 1) {
        Imath_3_2::Matrix33<double>::operator[]
                  ((Matrix33<double> *)&stack0xfffffffffffffe88,local_17c);
        pMVar2 = local_8;
        Imath_3_2::Matrix33<double>::operator[]((Matrix33<double> *)local_8,local_17c);
        std::abs((int)pMVar2);
        if (local_30 < extraout_XMM0_Qa) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x55,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]")
          ;
        }
      }
    }
    if ((local_35 & 1) != 0) {
      dVar3 = Imath_3_2::Matrix33<double>::determinant(&local_80);
      if (dVar3 <= 0.9) {
        __assert_fail("U.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5a,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
      dVar3 = Imath_3_2::Matrix33<double>::determinant(&local_c8);
      if (dVar3 <= 0.9) {
        __assert_fail("V.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5b,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    for (in_stack_fffffffffffffe7c = 0; in_stack_fffffffffffffe7c < 2;
        in_stack_fffffffffffffe7c = in_stack_fffffffffffffe7c + 1) {
      pdVar1 = Imath_3_2::Vec3<double>::operator[](&local_e0,in_stack_fffffffffffffe7c);
      dVar3 = *pdVar1;
      pdVar1 = Imath_3_2::Vec3<double>::operator[](&local_e0,in_stack_fffffffffffffe7c + 1);
      if (dVar3 < *pdVar1) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x60,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    for (in_stack_fffffffffffffe78 = 0; in_stack_fffffffffffffe78 < 2;
        in_stack_fffffffffffffe78 = in_stack_fffffffffffffe78 + 1) {
      pdVar1 = Imath_3_2::Vec3<double>::operator[](&local_e0,in_stack_fffffffffffffe78);
      if (*pdVar1 < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,100,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    if (((local_35 & 1) == 0) &&
       (pdVar1 = Imath_3_2::Vec3<double>::operator[](&local_e0,2), *pdVar1 < 0.0)) break;
    verifyOrthonormal<double>(in_stack_ffffffffffffff00);
    verifyOrthonormal<double>(in_stack_ffffffffffffff00);
    local_34 = local_34 + 1;
  }
  __assert_fail("S[2] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x66,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (10) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec3<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix33<T> product = U * S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V are orthogonal:
        if (posDet)
        {
            assert (U.determinant () > 0.9);
            assert (V.determinant () > 0.9);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[2] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}